

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int addr_eliminable_p(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn,VARR_bb_insn_t *bb_mem_insns)

{
  int iVar1;
  size_t sVar2;
  bb_insn_t_conflict bb_insn_00;
  bb_insn_t_conflict copy_bb_insn;
  int res;
  VARR_bb_insn_t *bb_mem_insns_local;
  bb_insn_t_conflict bb_insn_local;
  gen_ctx_t gen_ctx_local;
  
  bitmap_clear(gen_ctx->temp_bitmap2);
  VARR_bb_insn_ttrunc(gen_ctx->temp_bb_insns2,0);
  if (bb_mem_insns != (VARR_bb_insn_t *)0x0) {
    VARR_bb_insn_ttrunc(bb_mem_insns,0);
  }
  iVar1 = collect_addr_uses(gen_ctx,bb_insn,bb_mem_insns);
  copy_bb_insn._4_4_ = (uint)(iVar1 != 0);
  while (sVar2 = VARR_bb_insn_tlength(gen_ctx->temp_bb_insns2), sVar2 != 0) {
    bb_insn_00 = VARR_bb_insn_tpop(gen_ctx->temp_bb_insns2);
    iVar1 = collect_addr_uses(gen_ctx,bb_insn_00,bb_mem_insns);
    if (iVar1 == 0) {
      copy_bb_insn._4_4_ = 0;
    }
  }
  return copy_bb_insn._4_4_;
}

Assistant:

static int addr_eliminable_p (gen_ctx_t gen_ctx, bb_insn_t bb_insn,
                              VARR (bb_insn_t) * bb_mem_insns) {
  int res = TRUE;

  bitmap_clear (temp_bitmap2);
  VARR_TRUNC (bb_insn_t, temp_bb_insns2, 0);
  if (bb_mem_insns != NULL) VARR_TRUNC (bb_insn_t, bb_mem_insns, 0);
  if (!collect_addr_uses (gen_ctx, bb_insn, bb_mem_insns)) res = FALSE;
  while (VARR_LENGTH (bb_insn_t, temp_bb_insns2) != 0) {
    bb_insn_t copy_bb_insn = VARR_POP (bb_insn_t, temp_bb_insns2);
    if (!collect_addr_uses (gen_ctx, copy_bb_insn, bb_mem_insns)) res = FALSE;
  }
  return res;
}